

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateInterface
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Context *context;
  string *psVar1;
  ImmutableFieldLiteGenerator *pIVar2;
  Descriptor *pDVar3;
  OneofGeneratorInfo *pOVar4;
  ClassNameResolver *this_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  int i;
  long lVar5;
  char *pcVar6;
  long lVar7;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string((string *)&local_90,"OrBuilder",(allocator *)&local_70);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar3,true,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar3 + 0x68) < 1) {
    pcVar6 = "";
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) != '\0') {
      pcVar6 = "@java.lang.Deprecated ";
    }
    std::__cxx11::string::string((string *)&local_90,pcVar6,&local_91);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_70,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    psVar1 = *(string **)(this->super_MessageGenerator).descriptor_;
    std::__cxx11::string::string((string *)&local_50,"",&local_92);
    io::Printer::Print(printer,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageLiteOrBuilder {\n"
                       ,"deprecation",&local_90,"extra_interfaces",&local_70,"classname",psVar1,
                       "idend",&local_50);
  }
  else {
    pcVar6 = "";
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) != '\0') {
      pcVar6 = "@java.lang.Deprecated ";
    }
    std::__cxx11::string::string((string *)&local_90,pcVar6,&local_91);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_70,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    psVar1 = *(string **)(this->super_MessageGenerator).descriptor_;
    std::__cxx11::string::string((string *)&local_50,"",&local_92);
    io::Printer::Print(printer,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends \n    $extra_interfaces$\n     com.google.protobuf.GeneratedMessageLite.\n          ExtendableMessageOrBuilder<\n              $classname$, $classname$.Builder> {\n"
                       ,"deprecation",&local_90,"extra_interfaces",&local_70,"classname",psVar1,
                       "idend",&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,"classname","idend",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  lVar7 = 0;
  for (lVar5 = 0; pDVar3 = (this->super_MessageGenerator).descriptor_,
      lVar5 < *(int *)(pDVar3 + 0x2c); lVar5 = lVar5 + 1) {
    io::Printer::Print(printer,"\n");
    pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x30) + lVar7));
    (*pIVar2->_vptr_ImmutableFieldLiteGenerator[4])(pIVar2,printer);
    lVar7 = lVar7 + 0xa8;
  }
  lVar7 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(pDVar3 + 0x38); lVar5 = lVar5 + 1) {
    pOVar4 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar3 + 0x40) + lVar7));
    this_00 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_90,this_00,(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,
                       "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
                       ,"oneof_capitalized_name",&pOVar4->capitalized_name,"classname",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pDVar3 = (this->super_MessageGenerator).descriptor_;
    lVar7 = lVar7 + 0x30;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends \n"
        "    $extra_interfaces$\n"
        "     com.google.protobuf.GeneratedMessageLite.\n"
        "          ExtendableMessageOrBuilder<\n"
        "              $classname$, $classname$.Builder> {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "");
  } else {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageLiteOrBuilder {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "");
  }
  printer->Annotate("classname", "idend", descriptor_);

  printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      printer->Print("\n");
      field_generators_.get(descriptor_->field(i))
                       .GenerateInterfaceMembers(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
          "\n"
          "public $classname$.$oneof_capitalized_name$Case "
          "get$oneof_capitalized_name$Case();\n",
          "oneof_capitalized_name",
          context_->GetOneofGeneratorInfo(
              descriptor_->oneof_decl(i))->capitalized_name,
          "classname",
          context_->GetNameResolver()->GetImmutableClassName(descriptor_));
    }
  printer->Outdent();

  printer->Print("}\n");
}